

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testclip.cpp
# Opt level: O0

void test_clear_clipping(void)

{
  undefined8 in_stack_ffffffffffffff78;
  undefined4 uVar1;
  undefined8 in_stack_ffffffffffffff80;
  uint uVar2;
  Am_Style *arg7;
  Am_Style local_60 [8];
  Am_Style local_58 [8];
  Am_Style local_50 [8];
  Am_Style local_48 [8];
  Am_Style local_40 [8];
  Am_Style local_38 [24];
  Am_Style local_20 [8];
  Am_Style local_18 [12];
  int local_c;
  int counter;
  
  uVar1 = (undefined4)((ulong)in_stack_ffffffffffffff78 >> 0x20);
  uVar2 = (uint)((ulong)in_stack_ffffffffffffff80 >> 0x20);
  printf("Testing clip-regions with Clear_Area():\n");
  printf("  Hit RETURN to black-out drawonable and clear an area:");
  getchar();
  (**(code **)(*(long *)d1 + 0xe8))();
  (**(code **)(*(long *)d1 + 0x160))
            (d1,&Am_No_Style,&black,0,0,300,CONCAT44(uVar1,200),(ulong)uVar2 << 0x20);
  (**(code **)(*(long *)d1 + 0xf8))(d1,10,10,0x118,0xb4);
  clear_whole_window(d1);
  (**(code **)(*(long *)d1 + 0xa0))();
  printf("  Hit RETURN 6 times to nest Am_Drawonable clipping,\n");
  printf("      while alternately drawing big rectangles and clearing:  ");
  Am_Style::Am_Style(local_18,(Am_Style *)&red);
  Am_Style::Am_Style(local_20,(Am_Style *)&red);
  Am_Style::Am_Style(local_38,(Am_Style *)&blue);
  Am_Style::Am_Style(local_40,(Am_Style *)&blue);
  Am_Style::Am_Style(local_48,(Am_Style *)&red);
  Am_Style::Am_Style(local_50,(Am_Style *)&red);
  Am_Style::Am_Style(local_58,(Am_Style *)&Am_No_Style);
  Am_Style::Am_Style(local_60,(Am_Style *)&Am_No_Style);
  arg7 = local_60;
  set_style_array(local_18,local_20,local_38,local_40,local_48,local_50,local_58,arg7);
  Am_Style::~Am_Style(local_60);
  Am_Style::~Am_Style(local_58);
  Am_Style::~Am_Style(local_50);
  Am_Style::~Am_Style(local_48);
  Am_Style::~Am_Style(local_40);
  Am_Style::~Am_Style(local_38);
  Am_Style::~Am_Style(local_20);
  Am_Style::~Am_Style(local_18);
  for (local_c = 0; local_c < 6; local_c = local_c + 1) {
    getchar();
    printf("%d  ",(ulong)(local_c + 1));
    (**(code **)(*(long *)d1 + 0x108))(d1,0,0,local_c * -0x14 + 0x122,local_c * -0x14 + 0xbe);
    if (local_c % 2 == 0) {
      arg7 = (Am_Style *)((ulong)arg7 & 0xffffffff00000000);
      (**(code **)(*(long *)d1 + 0x160))
                (d1,&Am_No_Style,style_array + (long)local_c * 8,0,0,300,200,arg7);
    }
    else {
      clear_whole_window(d1);
    }
    (**(code **)(*(long *)d1 + 0xa0))();
  }
  printf("\n");
  return;
}

Assistant:

void
test_clear_clipping()
{
  printf("Testing clip-regions with Clear_Area():\n");

  printf("  Hit RETURN to black-out drawonable and clear an area:");
  getchar();

  d1->Clear_Clip();
  d1->Draw_Rectangle(Am_No_Style, black, 0, 0, 300, 200);
  d1->Set_Clip(10, 10, 280, 180);
  clear_whole_window(d1);
  ;
  d1->Flush_Output();

  int counter;
  printf("  Hit RETURN 6 times to nest Am_Drawonable clipping,\n");
  printf("      while alternately drawing big rectangles and clearing:  ");
  set_style_array(red, red, blue, blue, red, red);

  for (counter = 0; counter <= 5; counter++) {
    getchar();
    printf("%d  ", counter + 1);
    d1->Push_Clip(0, 0, 290 - 20 * counter, 190 - 20 * counter);
    if (counter % 2)
      clear_whole_window(d1);
    else
      d1->Draw_Rectangle(Am_No_Style, style_array[counter], 0, 0, 300, 200);
    d1->Flush_Output();
  }
  printf("\n");
}